

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_draw_command * nk__draw_list_next(nk_draw_command *cmd,nk_buffer *buffer,nk_draw_list *canvas)

{
  nk_draw_command *pnVar1;
  
  if (buffer == (nk_buffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x1ea1,
                  "const struct nk_draw_command *nk__draw_list_next(const struct nk_draw_command *, const struct nk_buffer *, const struct nk_draw_list *)"
                 );
  }
  if (canvas == (nk_draw_list *)0x0) {
    __assert_fail("canvas",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x1ea2,
                  "const struct nk_draw_command *nk__draw_list_next(const struct nk_draw_command *, const struct nk_buffer *, const struct nk_draw_list *)"
                 );
  }
  if (cmd == (nk_draw_command *)0x0) {
    pnVar1 = (nk_draw_command *)0x0;
  }
  else {
    pnVar1 = (nk_draw_command *)0x0;
    if ((nk_draw_command *)
        ((long)(buffer->memory).ptr +
        (ulong)(canvas->cmd_count - 1) * -0x20 + ((buffer->memory).size - canvas->cmd_offset)) < cmd
       ) {
      pnVar1 = cmd + -1;
    }
  }
  return pnVar1;
}

Assistant:

NK_API const struct nk_draw_command*
nk__draw_list_next(const struct nk_draw_command *cmd,
    const struct nk_buffer *buffer, const struct nk_draw_list *canvas)
{
    const struct nk_draw_command *end;
    NK_ASSERT(buffer);
    NK_ASSERT(canvas);
    if (!cmd || !buffer || !canvas)
        return 0;

    end = nk__draw_list_end(canvas, buffer);
    if (cmd <= end) return 0;
    return (cmd-1);
}